

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi,void **scanResults,int *count)

{
  PaAlsaHostApiRepresentation *pPVar1;
  PaUtilAllocationGroup *pPVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  byte *pbVar13;
  char *pcVar14;
  PaAlsaDeviceInfo *pPVar15;
  PaAlsaDeviceInfo *pPVar16;
  PaAlsaDeviceInfo *pPVar17;
  undefined8 uVar18;
  PaLinuxScanDeviceInfosResults *pPVar19;
  PaDeviceInfo **ppPVar20;
  byte bVar21;
  char **ppcVar22;
  char *pcVar23;
  char *pcVar24;
  byte bVar25;
  byte *pbVar26;
  byte *pbVar27;
  byte bVar28;
  HwDevInfo *pHVar29;
  PaLinuxScanDeviceInfosResults *pPVar30;
  long lVar31;
  snd_ctl_t *psVar32;
  char acStack_160 [16];
  char alsaCardName [50];
  char *local_118;
  char buf [67];
  char *local_c8;
  char *alsaDeviceName;
  char *local_b8;
  int *local_b0;
  void **local_a8;
  undefined8 local_a0;
  snd_config_t *topNode;
  char *local_90;
  PaLinuxScanDeviceInfosResults *local_88;
  PaLinuxScanDeviceInfosResults *local_80;
  uint local_74;
  PaAlsaDeviceInfo *local_70;
  byte *local_68;
  char *cardName;
  snd_ctl_t *ctl;
  int local_4c;
  HwDevInfo *pHStack_48;
  int devIdx_1;
  int local_3c;
  PaLinuxScanDeviceInfosResults *pPStack_38;
  int devIdx;
  
  local_3c = 0;
  local_a0 = 0;
  acStack_160[0] = -0x6b;
  acStack_160[1] = '=';
  acStack_160[2] = '\x11';
  acStack_160[3] = '\0';
  acStack_160[4] = '\0';
  acStack_160[5] = '\0';
  acStack_160[6] = '\0';
  acStack_160[7] = '\0';
  local_b0 = count;
  local_a8 = scanResults;
  pcVar10 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar10 == (char *)0x0) {
    local_74 = 1;
  }
  else {
    acStack_160[0] = -0x5e;
    acStack_160[1] = '=';
    acStack_160[2] = '\x11';
    acStack_160[3] = '\0';
    acStack_160[4] = '\0';
    acStack_160[5] = '\0';
    acStack_160[6] = '\0';
    acStack_160[7] = '\0';
    iVar7 = atoi(pcVar10);
    local_74 = (uint)(iVar7 == 0);
  }
  acStack_160[0] = -0x3f;
  acStack_160[1] = '=';
  acStack_160[2] = '\x11';
  acStack_160[3] = '\0';
  acStack_160[4] = '\0';
  acStack_160[5] = '\0';
  acStack_160[6] = '\0';
  acStack_160[7] = '\0';
  pcVar10 = getenv("PA_ALSA_PLUGHW");
  if (pcVar10 == (char *)0x0) {
    topNode._4_4_ = 0;
    local_90 = "";
  }
  else {
    acStack_160[0] = -0x32;
    acStack_160[1] = '=';
    acStack_160[2] = '\x11';
    acStack_160[3] = '\0';
    acStack_160[4] = '\0';
    acStack_160[5] = '\0';
    acStack_160[6] = '\0';
    acStack_160[7] = '\0';
    iVar7 = atoi(pcVar10);
    topNode._4_4_ = (uint)(iVar7 != 0);
    local_90 = "";
    if (iVar7 != 0) {
      local_90 = "plug";
    }
  }
  topNode._0_4_ = -1;
  builtin_strncpy(acStack_160," >\x11",4);
  acStack_160[4] = '\0';
  acStack_160[5] = '\0';
  acStack_160[6] = '\0';
  acStack_160[7] = '\0';
  sVar11 = snd_ctl_card_info_sizeof();
  lVar4 = -(sVar11 + 0xf & 0xfffffffffffffff0);
  pcVar10 = acStack_160 + lVar4 + 8;
  pHStack_48 = (HwDevInfo *)0x0;
  pcVar23 = acStack_160 + lVar4;
  local_b8 = pcVar10;
  builtin_strncpy(acStack_160 + lVar4,"J>\x11",4);
  pcVar23[4] = '\0';
  pcVar23[5] = '\0';
  pcVar23[6] = '\0';
  pcVar23[7] = '\0';
  memset(pcVar10,0,sVar11);
  pcVar24 = acStack_160 + lVar4;
  builtin_strncpy(acStack_160 + lVar4,"O>\x11",4);
  pcVar24[4] = '\0';
  pcVar24[5] = '\0';
  pcVar24[6] = '\0';
  pcVar24[7] = '\0';
  sVar11 = snd_pcm_info_sizeof();
  lVar5 = -(sVar11 + 0xf & 0xfffffffffffffff0);
  pcVar10 = pcVar10 + lVar5;
  builtin_strncpy(acStack_160 + lVar5 + lVar4,"m>\x11",4);
  pcVar10[-4] = '\0';
  pcVar10[-3] = '\0';
  pcVar10[-2] = '\0';
  pcVar10[-1] = '\0';
  memset(pcVar10,0,sVar11);
  builtin_strncpy(acStack_160 + lVar5 + lVar4,"u>\x11",4);
  pcVar10[-4] = '\0';
  pcVar10[-3] = '\0';
  pcVar10[-2] = '\0';
  pcVar10[-1] = '\0';
  iVar7 = snd_card_next(&topNode);
  ctl = (snd_ctl_t *)alsaApi;
  if ((int)topNode < 0 || iVar7 != 0) {
    local_88 = (PaLinuxScanDeviceInfosResults *)0x1;
    pPStack_38 = (PaLinuxScanDeviceInfosResults *)0x0;
  }
  else {
    local_88 = (PaLinuxScanDeviceInfosResults *)0x1;
    pPStack_38 = (PaLinuxScanDeviceInfosResults *)0x0;
    pHStack_48 = (HwDevInfo *)0x0;
    pcVar14 = pcVar10;
    alsaDeviceName = pcVar10;
    do {
      local_4c = -1;
      pcVar10[-8] = -0x1e;
      pcVar10[-7] = '>';
      pcVar10[-6] = '\x11';
      pcVar10[-5] = '\0';
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      snprintf(acStack_160 + 8,0x32,"hw:%d");
      pcVar10[-8] = -0x10;
      pcVar10[-7] = '>';
      pcVar10[-6] = '\x11';
      pcVar10[-5] = '\0';
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      iVar7 = snd_ctl_open(&cardName,acStack_160 + 8,0);
      pcVar3 = cardName;
      pcVar12 = local_b8;
      if (-1 < iVar7) {
        builtin_strncpy(acStack_160 + lVar5 + lVar4,"\v?\x11",4);
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        snd_ctl_card_info(pcVar3,pcVar12);
        builtin_strncpy(acStack_160 + lVar5 + lVar4,"\x13?\x11",4);
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        pcVar12 = (char *)snd_ctl_card_info_get_name(pcVar12);
        pPVar1 = (PaAlsaHostApiRepresentation *)alsaApi->allocations;
        builtin_strncpy(acStack_160 + lVar5 + lVar4,"&?\x11",4);
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        paUtilErr_ = PaAlsa_StrDup(pPVar1,(char **)&local_68,pcVar12);
        pcVar12 = cardName;
        if (paUtilErr_ < 0) goto LAB_00114716;
        builtin_strncpy(acStack_160 + lVar5 + lVar4,"A?\x11",4);
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        iVar7 = snd_ctl_pcm_next_device(pcVar12,&local_4c);
        if (-1 < local_4c && iVar7 == 0) {
          do {
            pcVar12 = local_90;
            builtin_strncpy(acStack_160 + lVar5 + lVar4,"\x7f?\x11",4);
            pcVar10[-4] = '\0';
            pcVar10[-3] = '\0';
            pcVar10[-2] = '\0';
            pcVar10[-1] = '\0';
            snprintf((char *)&local_118,0x43,"%s%s,%d",pcVar12,acStack_160 + 8);
            iVar7 = local_4c;
            pcVar10[-8] = -0x76;
            pcVar10[-7] = '?';
            pcVar10[-6] = '\x11';
            pcVar10[-5] = '\0';
            pcVar10[-4] = '\0';
            pcVar10[-3] = '\0';
            pcVar10[-2] = '\0';
            pcVar10[-1] = '\0';
            snd_pcm_info_set_device(pcVar14,iVar7);
            pcVar10[-8] = -0x6c;
            pcVar10[-7] = '?';
            pcVar10[-6] = '\x11';
            pcVar10[-5] = '\0';
            pcVar10[-4] = '\0';
            pcVar10[-3] = '\0';
            pcVar10[-2] = '\0';
            pcVar10[-1] = '\0';
            snd_pcm_info_set_subdevice(pcVar14,0);
            pcVar10[-8] = -0x5f;
            pcVar10[-7] = '?';
            pcVar10[-6] = '\x11';
            pcVar10[-5] = '\0';
            pcVar10[-4] = '\0';
            pcVar10[-3] = '\0';
            pcVar10[-2] = '\0';
            pcVar10[-1] = '\0';
            snd_pcm_info_set_stream(pcVar14,1);
            pcVar12 = cardName;
            pcVar10[-8] = -0x53;
            pcVar10[-7] = '?';
            pcVar10[-6] = '\x11';
            pcVar10[-5] = '\0';
            pcVar10[-4] = '\0';
            pcVar10[-3] = '\0';
            pcVar10[-2] = '\0';
            pcVar10[-1] = '\0';
            uVar8 = snd_ctl_pcm_info(pcVar12,pcVar14);
            pcVar10[-8] = -0x47;
            pcVar10[-7] = '?';
            pcVar10[-6] = '\x11';
            pcVar10[-5] = '\0';
            pcVar10[-4] = '\0';
            pcVar10[-3] = '\0';
            pcVar10[-2] = '\0';
            pcVar10[-1] = '\0';
            snd_pcm_info_set_stream(pcVar14,0);
            pcVar12 = cardName;
            pcVar10[-8] = -0x3b;
            pcVar10[-7] = '?';
            pcVar10[-6] = '\x11';
            pcVar10[-5] = '\0';
            pcVar10[-4] = '\0';
            pcVar10[-3] = '\0';
            pcVar10[-2] = '\0';
            pcVar10[-1] = '\0';
            uVar9 = snd_ctl_pcm_info(pcVar12,pcVar14);
            if (-1 < (int)(uVar9 & uVar8)) {
              local_80 = (PaLinuxScanDeviceInfosResults *)CONCAT44(local_80._4_4_,uVar9);
              pcVar10[-8] = -0x28;
              pcVar10[-7] = '?';
              pcVar10[-6] = '\x11';
              pcVar10[-5] = '\0';
              pcVar10[-4] = '\0';
              pcVar10[-3] = '\0';
              pcVar10[-2] = '\0';
              pcVar10[-1] = '\0';
              pbVar13 = (byte *)snd_pcm_info_get_name();
              pbVar6 = local_68;
              bVar21 = *pbVar13;
              bVar28 = *local_68;
              bVar25 = bVar21;
              pbVar26 = local_68;
              while (bVar28 != 0) {
                pbVar27 = pbVar13;
                bVar21 = bVar25;
                bVar28 = bVar25;
                if (bVar25 == 0) {
                  bVar25 = 0;
                  bVar21 = 0;
                }
                else {
                  do {
                    pbVar27 = pbVar27 + 1;
                    if (bVar28 != *pbVar26) break;
                    bVar28 = *pbVar27;
                    if ((bVar28 & 0xdf) == 0) {
                      pbVar13 = pbVar27;
                      bVar21 = bVar28;
                      bVar25 = bVar28;
                    }
                    pbVar26 = pbVar26 + 1;
                  } while (bVar28 != 0);
                }
                do {
                  bVar28 = *pbVar26;
                  if (bVar28 == 0) goto LAB_00114038;
                  pbVar26 = pbVar26 + 1;
                } while (bVar28 != 0x20);
                bVar28 = *pbVar26;
              }
LAB_00114038:
              pbVar26 = (byte *)"-";
              if (bVar21 != 0) {
                while (bVar21 == 0x20) {
                  pbVar26 = pbVar13 + 1;
                  pbVar13 = pbVar13 + 1;
                  bVar21 = *pbVar26;
                }
                if ((bVar21 == 0x2d) || (pbVar26 = pbVar13, bVar21 == 0x3a)) {
                  pbVar26 = pbVar13 + (ulong)(pbVar13[1] == 0x20) * 2;
                }
              }
              local_70 = (PaAlsaDeviceInfo *)CONCAT44(local_70._4_4_,uVar8);
              pcVar10[-8] = -0x7a;
              pcVar10[-7] = '@';
              pcVar10[-6] = '\x11';
              pcVar10[-5] = '\0';
              pcVar10[-4] = '\0';
              pcVar10[-3] = '\0';
              pcVar10[-2] = '\0';
              pcVar10[-1] = '\0';
              iVar7 = snprintf((char *)0x0,0,"%s: %s (%s)",pbVar6,pbVar26,&local_118);
              pPVar2 = *(PaUtilAllocationGroup **)(ctl + 0x120);
              pcVar10[-8] = -0x62;
              pcVar10[-7] = '@';
              pcVar10[-6] = '\x11';
              pcVar10[-5] = '\0';
              pcVar10[-4] = '\0';
              pcVar10[-3] = '\0';
              pcVar10[-2] = '\0';
              pcVar10[-1] = '\0';
              pcVar14 = (char *)PaUtil_GroupAllocateMemory(pPVar2,(long)(iVar7 + 1));
              pbVar13 = local_68;
              if (pcVar14 == (char *)0x0) {
                pcVar10[-8] = -0x37;
                pcVar10[-7] = 'F';
                pcVar10[-6] = '\x11';
                pcVar10[-5] = '\0';
                pcVar10[-4] = '\0';
                pcVar10[-3] = '\0';
                pcVar10[-2] = '\0';
                pcVar10[-1] = '\0';
                BuildDeviceList_cold_3();
LAB_001146c9:
                pcVar10[-8] = -0x32;
                pcVar10[-7] = 'F';
                pcVar10[-6] = '\x11';
                pcVar10[-5] = '\0';
                pcVar10[-4] = '\0';
                pcVar10[-3] = '\0';
                pcVar10[-2] = '\0';
                pcVar10[-1] = '\0';
                BuildDeviceList_cold_1();
              }
              else {
                pcVar10[-8] = -0x39;
                pcVar10[-7] = '@';
                pcVar10[-6] = '\x11';
                pcVar10[-5] = '\0';
                pcVar10[-4] = '\0';
                pcVar10[-3] = '\0';
                pcVar10[-2] = '\0';
                pcVar10[-1] = '\0';
                snprintf(pcVar14,(long)(iVar7 + 1),"%s: %s (%s)",pbVar13,pbVar26);
                pHVar29 = pHStack_48;
                pPVar19 = local_88;
                pPVar30 = (PaLinuxScanDeviceInfosResults *)((long)&pPStack_38->deviceInfos + 1);
                if ((pHStack_48 != (HwDevInfo *)0x0) && (pPVar30 <= local_88)) {
LAB_0011410e:
                  alsaApi = (PaAlsaHostApiRepresentation *)ctl;
                  pPVar1 = *(PaAlsaHostApiRepresentation **)(ctl + 0x120);
                  builtin_strncpy(acStack_160 + lVar5 + lVar4,"$A\x11",4);
                  pcVar10[-4] = '\0';
                  pcVar10[-3] = '\0';
                  pcVar10[-2] = '\0';
                  pcVar10[-1] = '\0';
                  paUtilErr_ = PaAlsa_StrDup(pPVar1,&local_c8,(char *)&local_118);
                  if (-1 < paUtilErr_) {
                    pHStack_48[(long)pPStack_38].alsaName = local_c8;
                    pHStack_48[(long)pPStack_38].name = pcVar14;
                    pHStack_48[(long)pPStack_38].isPlug = topNode._4_4_;
                    pHStack_48[(long)pPStack_38].hasPlayback = -(uint)(-1 < (int)local_80) >> 0x1f;
                    pHStack_48[(long)pPStack_38].hasCapture = -(uint)(-1 < (int)local_70) >> 0x1f;
                    pcVar14 = alsaDeviceName;
                    pPStack_38 = pPVar30;
                    goto LAB_0011418e;
                  }
                  goto LAB_001146c9;
                }
                sVar11 = (long)local_88 << 6;
                pcVar10[-8] = -0xd;
                pcVar10[-7] = '@';
                pcVar10[-6] = '\x11';
                pcVar10[-5] = '\0';
                pcVar10[-4] = '\0';
                pcVar10[-3] = '\0';
                pcVar10[-2] = '\0';
                pcVar10[-1] = '\0';
                pHVar29 = (HwDevInfo *)realloc(pHVar29,sVar11);
                if (pHVar29 != (HwDevInfo *)0x0) {
                  local_88 = (PaLinuxScanDeviceInfosResults *)((long)pPVar19 * 2);
                  pHStack_48 = pHVar29;
                  goto LAB_0011410e;
                }
              }
              pcVar10[-8] = -0x2d;
              pcVar10[-7] = 'F';
              pcVar10[-6] = '\x11';
              pcVar10[-5] = '\0';
              pcVar10[-4] = '\0';
              pcVar10[-3] = '\0';
              pcVar10[-2] = '\0';
              pcVar10[-1] = '\0';
              BuildDeviceList_cold_2();
              goto LAB_001146d3;
            }
LAB_0011418e:
            pcVar12 = cardName;
            pcVar10[-8] = -0x65;
            pcVar10[-7] = 'A';
            pcVar10[-6] = '\x11';
            pcVar10[-5] = '\0';
            pcVar10[-4] = '\0';
            pcVar10[-3] = '\0';
            pcVar10[-2] = '\0';
            pcVar10[-1] = '\0';
            iVar7 = snd_ctl_pcm_next_device(pcVar12,&local_4c);
          } while ((iVar7 == 0) && (-1 < local_4c));
        }
        pcVar12 = cardName;
        pcVar10[-8] = -0x4b;
        pcVar10[-7] = 'A';
        pcVar10[-6] = '\x11';
        pcVar10[-5] = '\0';
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        snd_ctl_close(pcVar12);
        pbVar13 = local_68;
        pPVar2 = alsaApi->allocations;
        pcVar10[-8] = -0x3b;
        pcVar10[-7] = 'A';
        pcVar10[-6] = '\x11';
        pcVar10[-5] = '\0';
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        PaUtil_GroupFreeMemory(pPVar2,pbVar13);
      }
      pcVar10[-8] = -0x2f;
      pcVar10[-7] = 'A';
      pcVar10[-6] = '\x11';
      pcVar10[-5] = '\0';
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      iVar7 = snd_card_next(&topNode);
    } while ((iVar7 == 0) && (-1 < (int)topNode));
  }
  pPVar30 = pPStack_38;
  if (_snd_config == 0) {
    builtin_strncpy(acStack_160 + lVar5 + lVar4,"\tB\x11",4);
    pcVar10[-4] = '\0';
    pcVar10[-3] = '\0';
    pcVar10[-2] = '\0';
    pcVar10[-1] = '\0';
    iVar7 = snd_config_update();
    if (iVar7 < 0) {
      builtin_strncpy(acStack_160 + lVar5 + lVar4,"gG\x11",4);
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      BuildDeviceList_cold_11();
LAB_00114767:
      builtin_strncpy(acStack_160 + lVar5 + lVar4,"nG\x11",4);
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      BuildDeviceList_cold_6();
      goto LAB_0011476e;
    }
    if (_snd_config == 0) {
      *(code **)(pcVar10 + -8) = PaAlsa_StrDup;
      __assert_fail("*alsa_snd_config",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x575,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *, void **, int *)")
      ;
    }
  }
  builtin_strncpy(acStack_160 + lVar5 + lVar4,"0B\x11",4);
  pcVar10[-4] = '\0';
  pcVar10[-3] = '\0';
  pcVar10[-2] = '\0';
  pcVar10[-1] = '\0';
  iVar7 = snd_config_search(_snd_config,"pcm",&local_a0);
  uVar18 = local_a0;
  if (-1 < iVar7) {
    builtin_strncpy(acStack_160 + lVar5 + lVar4,"DB\x11",4);
    pcVar10[-4] = '\0';
    pcVar10[-3] = '\0';
    pcVar10[-2] = '\0';
    pcVar10[-1] = '\0';
    pPVar15 = (PaAlsaDeviceInfo *)snd_config_iterator_first(uVar18);
    builtin_strncpy(acStack_160 + lVar5 + lVar4,"OB\x11",4);
    pcVar10[-4] = '\0';
    pcVar10[-3] = '\0';
    pcVar10[-2] = '\0';
    pcVar10[-1] = '\0';
    pPVar16 = (PaAlsaDeviceInfo *)snd_config_iterator_next(pPVar15);
    uVar18 = local_a0;
    builtin_strncpy(acStack_160 + lVar5 + lVar4,"^B\x11",4);
    pcVar10[-4] = '\0';
    pcVar10[-3] = '\0';
    pcVar10[-2] = '\0';
    pcVar10[-1] = '\0';
    pPVar17 = (PaAlsaDeviceInfo *)snd_config_iterator_end(uVar18);
    if (pPVar15 != pPVar17) {
      do {
        local_118 = "unknown";
        local_68 = (byte *)0x0;
        pcVar10[-8] = -0x72;
        pcVar10[-7] = 'B';
        pcVar10[-6] = '\x11';
        pcVar10[-5] = '\0';
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        uVar18 = snd_config_iterator_entry(pPVar15);
        cardName = (char *)0x0;
        pcVar10[-8] = -0x58;
        pcVar10[-7] = 'B';
        pcVar10[-6] = '\x11';
        pcVar10[-5] = '\0';
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        iVar7 = snd_config_search(uVar18,"type",&cardName);
        pcVar14 = cardName;
        if (iVar7 < 0) {
          if (iVar7 != -2) goto LAB_00114767;
        }
        else {
          pcVar10[-8] = -0x44;
          pcVar10[-7] = 'B';
          pcVar10[-6] = '\x11';
          pcVar10[-5] = '\0';
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          iVar7 = snd_config_get_string(pcVar14,&local_118);
          if (iVar7 < 0) goto LAB_0011471b;
        }
        pcVar10[-8] = -0x26;
        pcVar10[-7] = 'B';
        pcVar10[-6] = '\x11';
        pcVar10[-5] = '\0';
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        iVar7 = snd_config_get_id(uVar18,&local_68);
        pbVar13 = local_68;
        if (iVar7 < 0) {
          builtin_strncpy(acStack_160 + lVar5 + lVar4,"\x16G\x11",4);
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          BuildDeviceList_cold_7();
LAB_00114716:
          builtin_strncpy(acStack_160 + lVar5 + lVar4,"\x1bG\x11",4);
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          BuildDeviceList_cold_4();
LAB_0011471b:
          builtin_strncpy(acStack_160 + lVar5 + lVar4,"\"G\x11",4);
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          BuildDeviceList_cold_5();
LAB_00114722:
          builtin_strncpy(acStack_160 + lVar5 + lVar4,"\'G\x11",4);
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          BuildDeviceList_cold_10();
LAB_00114727:
          builtin_strncpy(acStack_160 + lVar5 + lVar4,",G\x11",4);
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          BuildDeviceList_cold_9();
LAB_0011472c:
          builtin_strncpy(acStack_160 + lVar5 + lVar4,"1G\x11",4);
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          BuildDeviceList_cold_8();
          goto LAB_00114731;
        }
        pcVar10[-8] = -0xe;
        pcVar10[-7] = 'B';
        pcVar10[-6] = '\x11';
        pcVar10[-5] = '\0';
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        pcVar14 = getenv("PA_ALSA_IGNORE_ALL_PLUGINS");
        if (pcVar14 == (char *)0x0) {
LAB_0011430b:
          lVar31 = 0;
          local_70 = pPVar16;
          do {
            pcVar14 = *(char **)((long)&IgnorePlugin_ignoredPlugins + lVar31);
            builtin_strncpy(acStack_160 + lVar5 + lVar4,"\x1eC\x11",4);
            pcVar10[-4] = '\0';
            pcVar10[-3] = '\0';
            pcVar10[-2] = '\0';
            pcVar10[-1] = '\0';
            iVar7 = strcmp((char *)pbVar13,pcVar14);
            psVar32 = ctl;
            pPVar15 = local_70;
            if (iVar7 == 0) goto LAB_00114499;
            lVar31 = lVar31 + 8;
          } while (lVar31 != 0x50);
          pPVar2 = *(PaUtilAllocationGroup **)(ctl + 0x120);
          pPStack_38 = pPVar30;
          builtin_strncpy(acStack_160 + lVar5 + lVar4,"HC\x11",4);
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          sVar11 = strlen((char *)pbVar13);
          builtin_strncpy(acStack_160 + lVar5 + lVar4,"TC\x11",4);
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          pcVar14 = (char *)PaUtil_GroupAllocateMemory(pPVar2,sVar11 + 6);
          pbVar13 = local_68;
          if (pcVar14 == (char *)0x0) goto LAB_00114722;
          builtin_strncpy(acStack_160 + lVar5 + lVar4,"lC\x11",4);
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          strcpy(pcVar14,(char *)pbVar13);
          pbVar13 = local_68;
          pPVar2 = *(PaUtilAllocationGroup **)(psVar32 + 0x120);
          builtin_strncpy(acStack_160 + lVar5 + lVar4,"}C\x11",4);
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          sVar11 = strlen((char *)pbVar13);
          pcVar10[-8] = -0x77;
          pcVar10[-7] = 'C';
          pcVar10[-6] = '\x11';
          pcVar10[-5] = '\0';
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          pcVar12 = (char *)PaUtil_GroupAllocateMemory(pPVar2,sVar11 + 1);
          pbVar13 = local_68;
          if (pcVar12 == (char *)0x0) goto LAB_00114727;
          pcVar10[-8] = -0x5f;
          pcVar10[-7] = 'C';
          pcVar10[-6] = '\x11';
          pcVar10[-5] = '\0';
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          strcpy(pcVar12,(char *)pbVar13);
          pHVar29 = pHStack_48;
          pPVar30 = local_88;
          local_80 = (PaLinuxScanDeviceInfosResults *)((long)&pPStack_38->deviceInfos + 1);
          if ((pHStack_48 == (HwDevInfo *)0x0) || (local_88 < local_80)) {
            sVar11 = (long)local_88 << 6;
            pcVar10[-8] = -0x25;
            pcVar10[-7] = 'C';
            pcVar10[-6] = '\x11';
            pcVar10[-5] = '\0';
            pcVar10[-4] = '\0';
            pcVar10[-3] = '\0';
            pcVar10[-2] = '\0';
            pcVar10[-1] = '\0';
            pHVar29 = (HwDevInfo *)realloc(pHVar29,sVar11);
            if (pHVar29 == (HwDevInfo *)0x0) goto LAB_0011472c;
            local_88 = (PaLinuxScanDeviceInfosResults *)((long)pPVar30 * 2);
            pHStack_48 = pHVar29;
          }
          if (predefinedNames[0].alsaName == (char *)0x0) {
LAB_0011445d:
            pHStack_48[(long)pPStack_38].alsaName = pcVar14;
            pHStack_48[(long)pPStack_38].name = pcVar12;
            pHStack_48[(long)pPStack_38].isPlug = 1;
            pHStack_48[(long)pPStack_38].hasPlayback = 1;
            iVar7 = 1;
          }
          else {
            builtin_strncpy(acStack_160 + lVar5 + lVar4,"\x06D\x11",4);
            pcVar10[-4] = '\0';
            pcVar10[-3] = '\0';
            pcVar10[-2] = '\0';
            pcVar10[-1] = '\0';
            iVar7 = strcmp(pcVar14,predefinedNames[0].alsaName);
            pHVar29 = predefinedNames;
            if (iVar7 != 0) {
              pHVar29 = predefinedNames;
              do {
                pcVar3 = pHVar29[1].alsaName;
                if (pcVar3 == (char *)0x0) goto LAB_0011445d;
                builtin_strncpy(acStack_160 + lVar5 + lVar4,"\"D\x11",4);
                pcVar10[-4] = '\0';
                pcVar10[-3] = '\0';
                pcVar10[-2] = '\0';
                pcVar10[-1] = '\0';
                iVar7 = strcmp(pcVar14,pcVar3);
                pHVar29 = pHVar29 + 1;
              } while (iVar7 != 0);
            }
            pHStack_48[(long)pPStack_38].alsaName = pcVar14;
            pHStack_48[(long)pPStack_38].name = pcVar12;
            pHStack_48[(long)pPStack_38].isPlug = 1;
            pHStack_48[(long)pPStack_38].hasPlayback = pHVar29->hasPlayback;
            iVar7 = pHVar29->hasCapture;
          }
          pHStack_48[(long)pPStack_38].hasCapture = iVar7;
          pPVar30 = local_80;
          pPVar15 = local_70;
        }
        else {
          pcVar10[-8] = -1;
          pcVar10[-7] = 'B';
          pcVar10[-6] = '\x11';
          pcVar10[-5] = '\0';
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          iVar7 = atoi(pcVar14);
          pPVar15 = pPVar16;
          if (iVar7 == 0) goto LAB_0011430b;
        }
LAB_00114499:
        pcVar10[-8] = -0x5f;
        pcVar10[-7] = 'D';
        pcVar10[-6] = '\x11';
        pcVar10[-5] = '\0';
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        pPVar16 = (PaAlsaDeviceInfo *)snd_config_iterator_next(pPVar15);
        uVar18 = local_a0;
        pcVar10[-8] = -0x50;
        pcVar10[-7] = 'D';
        pcVar10[-6] = '\x11';
        pcVar10[-5] = '\0';
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        pPVar17 = (PaAlsaDeviceInfo *)snd_config_iterator_end(uVar18);
      } while (pPVar15 != pPVar17);
    }
  }
  psVar32 = ctl;
  pPVar2 = *(PaUtilAllocationGroup **)(ctl + 0x120);
  pcVar10[-8] = -0x2a;
  pcVar10[-7] = 'D';
  pcVar10[-6] = '\x11';
  pcVar10[-5] = '\0';
  pcVar10[-4] = '\0';
  pcVar10[-3] = '\0';
  pcVar10[-2] = '\0';
  pcVar10[-1] = '\0';
  pPVar19 = (PaLinuxScanDeviceInfosResults *)PaUtil_GroupAllocateMemory(pPVar2,0x18);
  pPVar19->defaultInputDevice = -1;
  pPVar19->defaultOutputDevice = -1;
  pPVar2 = *(PaUtilAllocationGroup **)(psVar32 + 0x120);
  pcVar10[-8] = -0xb;
  pcVar10[-7] = 'D';
  pcVar10[-6] = '\x11';
  pcVar10[-5] = '\0';
  pcVar10[-4] = '\0';
  pcVar10[-3] = '\0';
  pcVar10[-2] = '\0';
  pcVar10[-1] = '\0';
  ppPVar20 = (PaDeviceInfo **)PaUtil_GroupAllocateMemory(pPVar2,(long)pPVar30 * 8);
  pPVar19->deviceInfos = ppPVar20;
  pPStack_38 = pPVar19;
  if (ppPVar20 == (PaDeviceInfo **)0x0) {
LAB_00114731:
    *(undefined **)(pcVar10 + -8) = &UNK_0011473f;
    PaUtil_DebugPrint(
                     "Expression \'out->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1474\n"
                     );
  }
  pPVar2 = *(PaUtilAllocationGroup **)(psVar32 + 0x120);
  builtin_strncpy(acStack_160 + lVar5 + lVar4,"\x15E\x11",4);
  pcVar10[-4] = '\0';
  pcVar10[-3] = '\0';
  pcVar10[-2] = '\0';
  pcVar10[-1] = '\0';
  pPVar15 = (PaAlsaDeviceInfo *)PaUtil_GroupAllocateMemory(pPVar2,(long)pPVar30 * 0x70);
  if (pPVar15 == (PaAlsaDeviceInfo *)0x0) {
    *(undefined **)(pcVar10 + -8) = &UNK_00114758;
    PaUtil_DebugPrint(
                     "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1478\n"
                     );
  }
  local_3c = 0;
  if (pPVar30 != (PaLinuxScanDeviceInfosResults *)0x0) {
    local_90 = 
    "Expression \'FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1498\n"
    ;
    pHVar29 = pHStack_48;
    local_80 = pPVar30;
    local_70 = pPVar15;
    do {
      pcVar14 = pHVar29->name;
      builtin_strncpy(acStack_160 + lVar5 + lVar4,"dE\x11",4);
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      iVar7 = strcmp(pcVar14,"dmix");
      if (iVar7 != 0) {
        builtin_strncpy(acStack_160 + lVar5 + lVar4,"wE\x11",4);
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        iVar7 = strcmp(pcVar14,"default");
        pPVar19 = pPStack_38;
        psVar32 = ctl;
        uVar8 = local_74;
        if (iVar7 != 0) {
          pcVar10[-8] = -0x6b;
          pcVar10[-7] = 'E';
          pcVar10[-6] = '\x11';
          pcVar10[-5] = '\0';
          pcVar10[-4] = '\0';
          pcVar10[-3] = '\0';
          pcVar10[-2] = '\0';
          pcVar10[-1] = '\0';
          paUtilErr_ = FillInDevInfo((PaAlsaHostApiRepresentation *)psVar32,pHVar29,uVar8,pPVar15,
                                     &local_3c,pPVar19);
          if (paUtilErr_ < 0) goto LAB_001146d3;
        }
      }
      pHVar29 = pHVar29 + 1;
      pPVar15 = pPVar15 + 1;
      pPVar30 = (PaLinuxScanDeviceInfosResults *)&pPVar30[-1].field_0x17;
    } while (pPVar30 != (PaLinuxScanDeviceInfosResults *)0x0);
    if (local_80 < (PaLinuxScanDeviceInfosResults *)(long)local_3c) {
LAB_0011476e:
      pcVar10[-8] = -0x73;
      pcVar10[-7] = 'G';
      pcVar10[-6] = '\x11';
      pcVar10[-5] = '\0';
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      __assert_fail("devIdx <= numDeviceNames",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x5dc,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *, void **, int *)")
      ;
    }
    local_90 = 
    "Expression \'FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1511\n"
    ;
    pPVar30 = local_80;
    pHVar29 = pHStack_48;
    pPVar17 = local_70;
    do {
      pcVar14 = pHVar29->name;
      pcVar10[-8] = -0x13;
      pcVar10[-7] = 'E';
      pcVar10[-6] = '\x11';
      pcVar10[-5] = '\0';
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      iVar7 = strcmp(pcVar14,"dmix");
      if (iVar7 == 0) {
LAB_00114604:
        pPVar19 = pPStack_38;
        psVar32 = ctl;
        uVar8 = local_74;
        builtin_strncpy(acStack_160 + lVar5 + lVar4,"\x1eF\x11",4);
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        paUtilErr_ = FillInDevInfo((PaAlsaHostApiRepresentation *)psVar32,pHVar29,uVar8,pPVar17,
                                   &local_3c,pPVar19);
        if (paUtilErr_ < 0) {
LAB_001146d3:
          pcVar14 = local_90;
          *(undefined **)(pcVar10 + -8) = &UNK_001146e1;
          PaUtil_DebugPrint(pcVar14);
        }
      }
      else {
        pcVar10[-8] = '\0';
        pcVar10[-7] = 'F';
        pcVar10[-6] = '\x11';
        pcVar10[-5] = '\0';
        pcVar10[-4] = '\0';
        pcVar10[-3] = '\0';
        pcVar10[-2] = '\0';
        pcVar10[-1] = '\0';
        iVar7 = strcmp(pcVar14,"default");
        if (iVar7 == 0) goto LAB_00114604;
      }
      psVar32 = ctl;
      pPVar15 = local_70;
      pHVar29 = pHVar29 + 1;
      pPVar17 = pPVar17 + 1;
      pPVar30 = (PaLinuxScanDeviceInfosResults *)&pPVar30[-1].field_0x17;
    } while (pPVar30 != (PaLinuxScanDeviceInfosResults *)0x0);
    ppcVar22 = &pHStack_48->name;
    pPVar30 = local_80;
    do {
      pPVar2 = *(PaUtilAllocationGroup **)(psVar32 + 0x120);
      pcVar14 = *ppcVar22;
      builtin_strncpy(acStack_160 + lVar5 + lVar4,"\\F\x11",4);
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      PaUtil_GroupFreeMemory(pPVar2,pcVar14);
      pPVar2 = *(PaUtilAllocationGroup **)(psVar32 + 0x120);
      pcVar14 = ((HwDevInfo *)(ppcVar22 + -1))->alsaName;
      builtin_strncpy(acStack_160 + lVar5 + lVar4,"lF\x11",4);
      pcVar10[-4] = '\0';
      pcVar10[-3] = '\0';
      pcVar10[-2] = '\0';
      pcVar10[-1] = '\0';
      PaUtil_GroupFreeMemory(pPVar2,pcVar14);
      ppcVar22 = ppcVar22 + 4;
      pPVar30 = (PaLinuxScanDeviceInfosResults *)&pPVar30[-1].field_0x17;
    } while (pPVar30 != (PaLinuxScanDeviceInfosResults *)0x0);
  }
  pHVar29 = pHStack_48;
  builtin_strncpy(acStack_160 + lVar5 + lVar4,"~F\x11",4);
  pcVar10[-4] = '\0';
  pcVar10[-3] = '\0';
  pcVar10[-2] = '\0';
  pcVar10[-1] = '\0';
  free(pHVar29);
  pPStack_38->deviceCount = local_3c;
  *local_a8 = pPStack_38;
  *local_b0 = local_3c;
  if (pPVar15 != (PaAlsaDeviceInfo *)0x0) {
    pPVar2 = *(PaUtilAllocationGroup **)(psVar32 + 0x120);
    pcVar10[-8] = -0x4e;
    pcVar10[-7] = 'F';
    pcVar10[-6] = '\x11';
    pcVar10[-5] = '\0';
    pcVar10[-4] = '\0';
    pcVar10[-3] = '\0';
    pcVar10[-2] = '\0';
    pcVar10[-1] = '\0';
    PaUtil_GroupFreeMemory(pPVar2,pPVar15);
  }
  return 0;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi, void** scanResults, int* count)
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif
    PaLinuxScanDeviceInfosResults* out = NULL;

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[67];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            PA_DEBUG(( "%s: Found device [%d]: %s\n", __FUNCTION__, numDeviceNames, deviceName ));

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
        PaUtil_GroupFreeMemory( alsaApi->allocations, cardName );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    out = (PaLinuxScanDeviceInfosResults *) PaUtil_GroupAllocateMemory(
                            alsaApi->allocations, sizeof(PaLinuxScanDeviceInfosResults) );

    out->defaultInputDevice = paNoDevice;
    out->defaultOutputDevice = paNoDevice;

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( out->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out ) );
    }
    assert( devIdx <= numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out ) );
    }

    for( i = 0; i < numDeviceNames; ++i )
    {
        HwDevInfo* hwInfo = &hwDevInfos[i];
        PaUtil_GroupFreeMemory( alsaApi->allocations, hwInfo->name );
        PaUtil_GroupFreeMemory( alsaApi->allocations, hwInfo->alsaName );
    }
    free( hwDevInfos );

    out->deviceCount = devIdx;   /* Number of successfully queried devices */
    *scanResults = out;
    *count = out->deviceCount;

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    if( deviceInfoArray )
    {
        PaUtil_GroupFreeMemory( alsaApi->allocations, deviceInfoArray );
    }

    return result;

error:
    if( out )
    {
        FreeDeviceInfos( alsaApi->allocations, out->deviceInfos, devIdx );
        out->deviceInfos = NULL;
    }

    goto end;
}